

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_pcnt_w_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  
  lVar1 = (ulong)wd * 0x10;
  lVar2 = (ulong)ws * 0x10;
  uVar3 = (env->active_fpu).fpr[ws].fs[0];
  uVar3 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
  uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
  uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
  uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
  (env->active_fpu).fpr[wd].fs[0] = (uVar3 >> 0x10) + (uVar3 & 0xff);
  uVar3 = *(uint *)((long)(env->active_fpu).fpr + lVar2 + 4);
  uVar3 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
  uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
  uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
  uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
  *(uint *)((long)(env->active_fpu).fpr + lVar1 + 4) = (uVar3 >> 0x10) + (uVar3 & 0xff);
  uVar3 = *(uint *)((long)(env->active_fpu).fpr + lVar2 + 8);
  uVar3 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
  uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
  uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
  uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
  *(uint *)((long)(env->active_fpu).fpr + lVar1 + 8) = (uVar3 >> 0x10) + (uVar3 & 0xff);
  uVar3 = *(uint *)((long)(env->active_fpu).fpr + lVar2 + 0xc);
  uVar3 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
  uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
  uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
  uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
  *(uint *)((long)(env->active_fpu).fpr + lVar1 + 0xc) = (uVar3 >> 0x10) + (uVar3 & 0xff);
  return;
}

Assistant:

void helper_msa_pcnt_w(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->w[0]  = msa_pcnt_df(DF_WORD, pws->w[0]);
    pwd->w[1]  = msa_pcnt_df(DF_WORD, pws->w[1]);
    pwd->w[2]  = msa_pcnt_df(DF_WORD, pws->w[2]);
    pwd->w[3]  = msa_pcnt_df(DF_WORD, pws->w[3]);
}